

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileImporter.cpp
# Opt level: O0

void __thiscall
Assimp::XFileImporter::ConvertMaterials
          (XFileImporter *this,aiScene *pScene,
          vector<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_> *pMaterials)

{
  aiMaterial **__src;
  undefined1 auVar1 [16];
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  ulong uVar5;
  aiMaterial **ppaVar6;
  char *pcVar7;
  char *__s2;
  Logger *this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this_01;
  basic_formatter *this_02;
  aiMaterial *this_03;
  long lVar8;
  undefined1 *puVar9;
  ulong uVar10;
  reference pString;
  undefined1 local_1278 [8];
  aiString tex_1;
  uint c;
  size_type sExt;
  size_type s;
  string local_e58 [8];
  string sz;
  TexEntry *otex_1;
  uint b;
  uint iEM;
  uint iAM;
  uint iSM;
  uint iDM;
  uint iNM;
  uint iHM;
  aiString tex;
  TexEntry *otex;
  int shadeMode;
  aiString name;
  aiMaterial *mat;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  string local_470;
  undefined1 local_44c [8];
  aiString name_1;
  size_t a_2;
  Material *oldMat;
  uint a_1;
  aiMaterial **prevMats;
  uint a;
  uint numNewMaterials;
  vector<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_> *pMaterials_local;
  aiScene *pScene_local;
  XFileImporter *this_local;
  
  prevMats._4_4_ = 0;
  for (prevMats._0_4_ = 0;
      sVar3 = std::vector<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>::size
                        (pMaterials), (uint)prevMats < sVar3; prevMats._0_4_ = (uint)prevMats + 1) {
    pvVar4 = std::vector<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>::
             operator[](pMaterials,(ulong)(uint)prevMats);
    if ((pvVar4->mIsReference & 1U) == 0) {
      prevMats._4_4_ = prevMats._4_4_ + 1;
    }
  }
  if (prevMats._4_4_ != 0) {
    __src = pScene->mMaterials;
    auVar1 = ZEXT416(pScene->mNumMaterials + prevMats._4_4_) * ZEXT816(8);
    uVar5 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    ppaVar6 = (aiMaterial **)operator_new__(uVar5);
    pScene->mMaterials = ppaVar6;
    if ((__src != (aiMaterial **)0x0) &&
       (memcpy(pScene->mMaterials,__src,(ulong)pScene->mNumMaterials << 3),
       __src != (aiMaterial **)0x0)) {
      operator_delete__(__src);
    }
  }
  oldMat._4_4_ = 0;
  do {
    sVar3 = std::vector<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>::size
                      (pMaterials);
    if (sVar3 <= oldMat._4_4_) {
      return;
    }
    pvVar4 = std::vector<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>::
             operator[](pMaterials,(ulong)oldMat._4_4_);
    if ((pvVar4->mIsReference & 1U) == 0) {
      this_03 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this_03);
      name.data._1016_8_ = this_03;
      aiString::aiString((aiString *)((long)&otex + 4));
      aiString::Set((aiString *)((long)&otex + 4),&pvVar4->mName);
      aiMaterial::AddProperty
                ((aiMaterial *)name.data._1016_8_,(aiString *)((long)&otex + 4),"?mat.name",0,0);
      otex._0_4_ = 3;
      if ((float)(int)pvVar4->mSpecularExponent == 0.0) {
        otex._0_4_ = 2;
      }
      aiMaterial::AddProperty<int>
                ((aiMaterial *)name.data._1016_8_,(int *)&otex,1,"$mat.shadingm",0,0);
      aiMaterial::AddProperty
                ((aiMaterial *)name.data._1016_8_,&pvVar4->mEmissive,1,"$clr.emissive",0,0);
      aiMaterial::AddProperty
                ((aiMaterial *)name.data._1016_8_,&pvVar4->mDiffuse,1,"$clr.diffuse",0,0);
      aiMaterial::AddProperty
                ((aiMaterial *)name.data._1016_8_,&pvVar4->mSpecular,1,"$clr.specular",0,0);
      aiMaterial::AddProperty
                ((aiMaterial *)name.data._1016_8_,&pvVar4->mSpecularExponent,1,"$mat.shininess",0,0)
      ;
      sVar3 = std::vector<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>::size
                        (&pvVar4->mTextures);
      if (sVar3 == 1) {
        tex.data._1016_8_ =
             std::vector<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>::back
                       (&pvVar4->mTextures);
        lVar8 = std::__cxx11::string::length();
        if (lVar8 != 0) {
          aiString::aiString((aiString *)&iNM,(string *)tex.data._1016_8_);
          if ((*(byte *)(tex.data._1016_8_ + 0x20) & 1) == 0) {
            aiMaterial::AddProperty
                      ((aiMaterial *)name.data._1016_8_,(aiString *)&iNM,"$tex.file",1,0);
          }
          else {
            aiMaterial::AddProperty
                      ((aiMaterial *)name.data._1016_8_,(aiString *)&iNM,"$tex.file",6,0);
          }
        }
      }
      else {
        iDM = 0;
        iSM = 0;
        iAM = 0;
        iEM = 0;
        b = 0;
        otex_1._4_4_ = 0;
        for (otex_1._0_4_ = 0;
            sVar3 = std::vector<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>::
                    size(&pvVar4->mTextures), (uint)otex_1 < sVar3; otex_1._0_4_ = (uint)otex_1 + 1)
        {
          sz.field_2._8_8_ =
               std::vector<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>::
               operator[](&pvVar4->mTextures,(ulong)(uint)otex_1);
          std::__cxx11::string::string(local_e58,(string *)sz.field_2._8_8_);
          lVar8 = std::__cxx11::string::length();
          if (lVar8 != 0) {
            std::__cxx11::string::find_last_of((char *)local_e58,0xb5c606);
            register0x00000000 = std::__cxx11::string::find_last_of((char)local_e58,0x2e);
            if (register0x00000000 != -1) {
              puVar9 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_e58);
              *puVar9 = 0;
            }
            tex_1.data[0x3f8] = '\0';
            tex_1.data[0x3f9] = '\0';
            tex_1.data[0x3fa] = '\0';
            tex_1.data[0x3fb] = '\0';
            for (; uVar5 = (ulong)(uint)tex_1.data._1016_4_, uVar10 = std::__cxx11::string::length()
                , uVar5 < uVar10; tex_1.data._1016_4_ = tex_1.data._1016_4_ + 1) {
              pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_e58);
              iVar2 = isalpha((int)*pcVar7);
              if (iVar2 != 0) {
                pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_e58);
                iVar2 = tolower((int)*pcVar7);
                puVar9 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_e58);
                *puVar9 = (char)iVar2;
              }
            }
            pString = std::vector<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>
                      ::operator[](&pvVar4->mTextures,(ulong)(uint)otex_1);
            aiString::aiString((aiString *)local_1278,&pString->mName);
            lVar8 = std::__cxx11::string::find((char *)local_e58,0xba23a4);
            if ((lVar8 == -1) &&
               (lVar8 = std::__cxx11::string::find((char *)local_e58,0xb55d1a), lVar8 == -1)) {
              if ((((*(byte *)(sz.field_2._8_8_ + 0x20) & 1) == 0) &&
                  (lVar8 = std::__cxx11::string::find((char *)local_e58,0xb6f6d3), lVar8 == -1)) &&
                 (lVar8 = std::__cxx11::string::find((char *)local_e58,0xb97789), lVar8 == -1)) {
                lVar8 = std::__cxx11::string::find((char *)local_e58,0xb737a6);
                if ((lVar8 == -1) &&
                   (lVar8 = std::__cxx11::string::find((char *)local_e58,0xb9778c), lVar8 == -1)) {
                  lVar8 = std::__cxx11::string::find((char *)local_e58,0xb97792);
                  if ((lVar8 == -1) &&
                     (lVar8 = std::__cxx11::string::find((char *)local_e58,0xb97797), lVar8 == -1))
                  {
                    lVar8 = std::__cxx11::string::find((char *)local_e58,0xb4e962);
                    if ((lVar8 == -1) &&
                       (lVar8 = std::__cxx11::string::find((char *)local_e58,0xb9779b), lVar8 == -1)
                       ) {
                      aiMaterial::AddProperty
                                ((aiMaterial *)name.data._1016_8_,(aiString *)local_1278,"$tex.file"
                                 ,1,iAM);
                      iAM = iAM + 1;
                    }
                    else {
                      aiMaterial::AddProperty
                                ((aiMaterial *)name.data._1016_8_,(aiString *)local_1278,"$tex.file"
                                 ,4,otex_1._4_4_);
                      otex_1._4_4_ = otex_1._4_4_ + 1;
                    }
                  }
                  else {
                    aiMaterial::AddProperty
                              ((aiMaterial *)name.data._1016_8_,(aiString *)local_1278,"$tex.file",3
                               ,b);
                    b = b + 1;
                  }
                }
                else {
                  aiMaterial::AddProperty
                            ((aiMaterial *)name.data._1016_8_,(aiString *)local_1278,"$tex.file",2,
                             iEM);
                  iEM = iEM + 1;
                }
              }
              else {
                aiMaterial::AddProperty
                          ((aiMaterial *)name.data._1016_8_,(aiString *)local_1278,"$tex.file",6,iSM
                          );
                iSM = iSM + 1;
              }
            }
            else {
              aiMaterial::AddProperty
                        ((aiMaterial *)name.data._1016_8_,(aiString *)local_1278,"$tex.file",5,iDM);
              iDM = iDM + 1;
            }
          }
          std::__cxx11::string::~string(local_e58);
        }
      }
      pScene->mMaterials[pScene->mNumMaterials] = (aiMaterial *)name.data._1016_8_;
      pvVar4->sceneIndex = (ulong)pScene->mNumMaterials;
      pScene->mNumMaterials = pScene->mNumMaterials + 1;
    }
    else {
      name_1.data[0x3f8] = '\0';
      name_1.data[0x3f9] = '\0';
      name_1.data[0x3fa] = '\0';
      name_1.data[0x3fb] = '\0';
      name_1.data[0x3fc] = '\0';
      name_1.data[0x3fd] = '\0';
      name_1.data[0x3fe] = '\0';
      name_1.data[0x3ff] = '\0';
      for (; (ulong)name_1.data._1016_8_ < (ulong)pScene->mNumMaterials;
          name_1.data._1016_8_ = name_1.data._1016_8_ + 1) {
        aiString::aiString((aiString *)local_44c);
        aiMaterial::Get(pScene->mMaterials[name_1.data._1016_8_],"?mat.name",0,0,
                        (aiString *)local_44c);
        pcVar7 = aiString::C_Str((aiString *)local_44c);
        __s2 = (char *)std::__cxx11::string::data();
        iVar2 = strcmp(pcVar7,__s2);
        if (iVar2 == 0) {
          pvVar4->sceneIndex = name_1.data._1016_8_;
          break;
        }
      }
      if (pvVar4->sceneIndex == 0xffffffffffffffff) {
        this_00 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[46]>
                  (&local_5e8,(char (*) [46])"Could not resolve global material reference \"");
        this_01 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                            &local_5e8,&pvVar4->mName);
        this_02 = (basic_formatter *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(this_01,(char (*) [2])0xb9e357);
        Formatter::basic_formatter::operator_cast_to_string(&local_470,this_02);
        Logger::warn(this_00,&local_470);
        std::__cxx11::string::~string((string *)&local_470);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_5e8);
        pvVar4->sceneIndex = 0;
      }
    }
    oldMat._4_4_ = oldMat._4_4_ + 1;
  } while( true );
}

Assistant:

void XFileImporter::ConvertMaterials( aiScene* pScene, std::vector<XFile::Material>& pMaterials)
{
    // count the non-referrer materials in the array
    unsigned int numNewMaterials( 0 );
    for ( unsigned int a = 0; a < pMaterials.size(); ++a ) {
        if ( !pMaterials[ a ].mIsReference ) {
            ++numNewMaterials;
        }
    }

    // resize the scene's material list to offer enough space for the new materials
    if( numNewMaterials > 0 ) {
        aiMaterial** prevMats = pScene->mMaterials;
        pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials + numNewMaterials];
        if( nullptr != prevMats)  {
            ::memcpy( pScene->mMaterials, prevMats, pScene->mNumMaterials * sizeof( aiMaterial*));
            delete [] prevMats;
        }
    }

    // convert all the materials given in the array
    for( unsigned int a = 0; a < pMaterials.size(); ++a ) {
        XFile::Material& oldMat = pMaterials[a];
        if( oldMat.mIsReference) {
            // find the material it refers to by name, and store its index
            for( size_t a = 0; a < pScene->mNumMaterials; ++a ) {
                aiString name;
                pScene->mMaterials[a]->Get( AI_MATKEY_NAME, name);
                if( strcmp( name.C_Str(), oldMat.mName.data()) == 0 ) {
                    oldMat.sceneIndex = a;
                    break;
                }
            }

            if( oldMat.sceneIndex == SIZE_MAX ) {
                ASSIMP_LOG_WARN_F( "Could not resolve global material reference \"", oldMat.mName, "\"" );
                oldMat.sceneIndex = 0;
            }

            continue;
        }

        aiMaterial* mat = new aiMaterial;
        aiString name;
        name.Set( oldMat.mName);
        mat->AddProperty( &name, AI_MATKEY_NAME);

        // Shading model: hard-coded to PHONG, there is no such information in an XFile
        // FIX (aramis): If the specular exponent is 0, use gouraud shading. This is a bugfix
        // for some models in the SDK (e.g. good old tiny.x)
        int shadeMode = (int)oldMat.mSpecularExponent == 0.0f
            ? aiShadingMode_Gouraud : aiShadingMode_Phong;

        mat->AddProperty<int>( &shadeMode, 1, AI_MATKEY_SHADING_MODEL);
        // material colours
        // Unclear: there's no ambient colour, but emissive. What to put for ambient?
        // Probably nothing at all, let the user select a suitable default.
        mat->AddProperty( &oldMat.mEmissive, 1, AI_MATKEY_COLOR_EMISSIVE);
        mat->AddProperty( &oldMat.mDiffuse, 1, AI_MATKEY_COLOR_DIFFUSE);
        mat->AddProperty( &oldMat.mSpecular, 1, AI_MATKEY_COLOR_SPECULAR);
        mat->AddProperty( &oldMat.mSpecularExponent, 1, AI_MATKEY_SHININESS);


        // texture, if there is one
        if (1 == oldMat.mTextures.size() ) {
            const XFile::TexEntry& otex = oldMat.mTextures.back();
            if (otex.mName.length()) {
                // if there is only one texture assume it contains the diffuse color
                aiString tex( otex.mName);
                if ( otex.mIsNormalMap ) {
                    mat->AddProperty( &tex, AI_MATKEY_TEXTURE_NORMALS( 0 ) );
                } else {
                    mat->AddProperty( &tex, AI_MATKEY_TEXTURE_DIFFUSE( 0 ) );
                }
            }
        } else {
            // Otherwise ... try to search for typical strings in the
            // texture's file name like 'bump' or 'diffuse'
            unsigned int iHM = 0,iNM = 0,iDM = 0,iSM = 0,iAM = 0,iEM = 0;
            for( unsigned int b = 0; b < oldMat.mTextures.size(); ++b ) {
                const XFile::TexEntry& otex = oldMat.mTextures[b];
                std::string sz = otex.mName;
                if ( !sz.length() ) {
                    continue;
                }

                // find the file name
                std::string::size_type s = sz.find_last_of("\\/");
                if ( std::string::npos == s ) {
                    s = 0;
                }

                // cut off the file extension
                std::string::size_type sExt = sz.find_last_of('.');
                if (std::string::npos != sExt){
                    sz[sExt] = '\0';
                }

                // convert to lower case for easier comparison
                for ( unsigned int c = 0; c < sz.length(); ++c ) {
                    if ( isalpha( sz[ c ] ) ) {
                        sz[ c ] = tolower( sz[ c ] );
                    }
                }

                // Place texture filename property under the corresponding name
                aiString tex( oldMat.mTextures[b].mName);

                // bump map
                if (std::string::npos != sz.find("bump", s) || std::string::npos != sz.find("height", s)) {
                    mat->AddProperty( &tex, AI_MATKEY_TEXTURE_HEIGHT(iHM++));
                } else if (otex.mIsNormalMap || std::string::npos != sz.find( "normal", s) || std::string::npos != sz.find("nm", s)) {
                    mat->AddProperty( &tex, AI_MATKEY_TEXTURE_NORMALS(iNM++));
                } else if (std::string::npos != sz.find( "spec", s) || std::string::npos != sz.find( "glanz", s)) {
                    mat->AddProperty( &tex, AI_MATKEY_TEXTURE_SPECULAR(iSM++));
                } else if (std::string::npos != sz.find( "ambi", s) || std::string::npos != sz.find( "env", s)) {
                    mat->AddProperty( &tex, AI_MATKEY_TEXTURE_AMBIENT(iAM++));
                } else if (std::string::npos != sz.find( "emissive", s) || std::string::npos != sz.find( "self", s)) {
                    mat->AddProperty( &tex, AI_MATKEY_TEXTURE_EMISSIVE(iEM++));
                } else {
                    // Assume it is a diffuse texture
                    mat->AddProperty( &tex, AI_MATKEY_TEXTURE_DIFFUSE(iDM++));
                }
            }
        }

        pScene->mMaterials[pScene->mNumMaterials] = mat;
        oldMat.sceneIndex = pScene->mNumMaterials;
        pScene->mNumMaterials++;
    }
}